

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainTestTest.cpp
# Opt level: O0

void __thiscall ContainTestTest::ContainTestTest(ContainTestTest *this)

{
  unique_ptr<oout::ContainTest,_std::default_delete<oout::ContainTest>_> local_88;
  unique_ptr<TestText,_std::default_delete<TestText>_> local_80;
  shared_ptr<oout::EqualTest> local_78;
  shared_ptr<const_oout::NamedTest> local_68 [2];
  unique_ptr<oout::ContainTest,_std::default_delete<oout::ContainTest>_> local_48;
  unique_ptr<TestText,_std::default_delete<TestText>_> local_40;
  shared_ptr<oout::EqualTest> local_38;
  shared_ptr<const_oout::NamedTest> local_28;
  unique_ptr<oout::NamedTest,_std::default_delete<oout::NamedTest>_> local_18;
  ContainTestTest *local_10;
  ContainTestTest *this_local;
  
  local_10 = this;
  oout::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ContainTestTest_00323700;
  std::make_unique<oout::ContainTest,char_const(&)[16],char_const(&)[6],char_const(&)[4]>
            ((char (*) [16])&local_48,(char (*) [6])"quick brown fox",(char (*) [4])"quick");
  std::
  make_unique<TestText,std::unique_ptr<oout::ContainTest,std::default_delete<oout::ContainTest>>>
            ((unique_ptr<oout::ContainTest,_std::default_delete<oout::ContainTest>_> *)&local_40);
  std::
  make_shared<oout::EqualTest,std::unique_ptr<TestText,std::default_delete<TestText>>,char_const(&)[8]>
            ((unique_ptr<TestText,_std::default_delete<TestText>_> *)&local_38,
             (char (*) [8])&local_40);
  std::make_shared<oout::NamedTest_const,char_const(&)[12],std::shared_ptr<oout::EqualTest>>
            ((char (*) [12])&local_28,(shared_ptr<oout::EqualTest> *)"Contain all");
  std::make_unique<oout::ContainTest,char_const(&)[24],char_const(&)[4],char_const(&)[4]>
            ((char (*) [24])&local_88,(char (*) [4])"jumps over the lazy dog",(char (*) [4])0x2c3ea2
            );
  std::
  make_unique<TestText,std::unique_ptr<oout::ContainTest,std::default_delete<oout::ContainTest>>>
            ((unique_ptr<oout::ContainTest,_std::default_delete<oout::ContainTest>_> *)&local_80);
  std::
  make_shared<oout::EqualTest,std::unique_ptr<TestText,std::default_delete<TestText>>,char_const(&)[8]>
            ((unique_ptr<TestText,_std::default_delete<TestText>_> *)&local_78,
             (char (*) [8])&local_80);
  std::make_shared<oout::NamedTest_const,char_const(&)[19],std::shared_ptr<oout::EqualTest>>
            ((char (*) [19])local_68,(shared_ptr<oout::EqualTest> *)"Not contain one of");
  std::
  make_unique<oout::NamedTest,char_const(&)[16],std::shared_ptr<oout::NamedTest_const>,std::shared_ptr<oout::NamedTest_const>>
            ((char (*) [16])&local_18,(shared_ptr<const_oout::NamedTest> *)"ContainTestTest",
             &local_28);
  std::unique_ptr<oout::Test_const,std::default_delete<oout::Test_const>>::
  unique_ptr<oout::NamedTest,std::default_delete<oout::NamedTest>,void>
            ((unique_ptr<oout::Test_const,std::default_delete<oout::Test_const>> *)&this->tests,
             &local_18);
  std::unique_ptr<oout::NamedTest,_std::default_delete<oout::NamedTest>_>::~unique_ptr(&local_18);
  std::shared_ptr<const_oout::NamedTest>::~shared_ptr(local_68);
  std::shared_ptr<oout::EqualTest>::~shared_ptr(&local_78);
  std::unique_ptr<TestText,_std::default_delete<TestText>_>::~unique_ptr(&local_80);
  std::unique_ptr<oout::ContainTest,_std::default_delete<oout::ContainTest>_>::~unique_ptr
            (&local_88);
  std::shared_ptr<const_oout::NamedTest>::~shared_ptr(&local_28);
  std::shared_ptr<oout::EqualTest>::~shared_ptr(&local_38);
  std::unique_ptr<TestText,_std::default_delete<TestText>_>::~unique_ptr(&local_40);
  std::unique_ptr<oout::ContainTest,_std::default_delete<oout::ContainTest>_>::~unique_ptr
            (&local_48);
  return;
}

Assistant:

ContainTestTest::ContainTestTest()
	: tests(
		make_unique<NamedTest>(
			"ContainTestTest",
			make_shared<const NamedTest>(
				"Contain all",
				make_shared<EqualTest>(
					make_unique<TestText>(
						make_unique<ContainTest>(
							"quick brown fox",
							"quick",
							"fox"
						)
					),
					"success"
				)
			),
			make_shared<const NamedTest>(
				"Not contain one of",
				make_shared<EqualTest>(
					make_unique<TestText>(
						make_unique<ContainTest>(
							"jumps over the lazy dog",
							"dog",
							"fox"
						)
					),
					"failure"
				)
			)
		)
	)
{
}